

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool get_token(HttpProxyNegotiator *s)

{
  byte bVar1;
  ulong uVar2;
  strbuf *psVar3;
  ulong uVar4;
  
  psVar3 = s->header;
  uVar4 = s->header_pos;
  uVar2 = psVar3->len;
  if (uVar4 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)psVar3->s[uVar4]) ||
         ((0x100000600U >> ((ulong)(byte)psVar3->s[uVar4] & 0x3f) & 1) == 0)) goto LAB_00144a6c;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  else {
LAB_00144a6c:
    if (uVar4 != uVar2) {
      bVar1 = psVar3->s[uVar4];
      if ((bVar1 - 0x22 < 0x3c) && ((0xe0000007f0024c1U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)
         ) {
        return false;
      }
      if (bVar1 == 0x7b) {
        return false;
      }
      if (bVar1 == 0x7d) {
        return false;
      }
      strbuf_shrink_to(s->token,0);
      psVar3 = s->header;
      if (uVar4 < psVar3->len) {
        do {
          bVar1 = psVar3->s[uVar4];
          if (((bVar1 - 9 < 0x38) && ((0xfe004982800003U >> ((ulong)(bVar1 - 9) & 0x3f) & 1) != 0))
             || ((bVar1 - 0x5b < 0x23 && ((0x500000007U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)
                 ))) break;
          uVar4 = uVar4 + 1;
          BinarySink_put_byte(s->token->binarysink_,bVar1);
          psVar3 = s->header;
        } while (uVar4 < psVar3->len);
      }
      s->header_pos = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

static bool get_token(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (is_separator(s->header->s[pos]))
        return false;

    strbuf_clear(s->token);
    while (pos < s->header->len &&
           !is_whitespace(s->header->s[pos]) &&
           !is_separator(s->header->s[pos]))
        put_byte(s->token, s->header->s[pos++]);

    s->header_pos = pos;
    return true;
}